

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fifteen.cpp
# Opt level: O2

void __thiscall Fifteen::initGame(Fifteen *this)

{
  MenuBar *pMVar1;
  Data *__p;
  undefined8 uVar2;
  QVBoxLayout *pQVar3;
  QWidget *pQVar4;
  QHBoxLayout *this_00;
  QGroupBox *pQVar5;
  QArrayDataPointer<char16_t> local_190;
  array<std::function<void_()>,_3UL> panelSlots;
  function<void_()> local_118;
  function<void_()> local_f8;
  function<void_()> local_d8;
  function<void_()> local_b8;
  function<void_()> local_98;
  function<void_()> local_78;
  _Bind<void_(Fifteen::*(Fifteen_*))()> local_58;
  _Bind<void_(Fifteen::*(Fifteen_*))()> local_40;
  
  QWidget::resize((QWidget *)this,0x352,600);
  std::make_unique<Controller>();
  uVar2 = panelSlots._M_elems[0].super__Function_base._M_functor._M_unused._0_8_;
  panelSlots._M_elems[0].super__Function_base._M_functor._M_unused._M_object = (void *)0x0;
  std::__uniq_ptr_impl<Controller,_std::default_delete<Controller>_>::reset
            ((__uniq_ptr_impl<Controller,_std::default_delete<Controller>_> *)&this->controller,
             (pointer)uVar2);
  std::unique_ptr<Controller,_std::default_delete<Controller>_>::~unique_ptr
            ((unique_ptr<Controller,_std::default_delete<Controller>_> *)&panelSlots);
  panelSlots._M_elems[0].super__Function_base._M_functor._M_unused._M_object = pressTile;
  panelSlots._M_elems[0].super__Function_base._M_functor._8_8_ = 0;
  panelSlots._M_elems[0].super__Function_base._M_manager = (_Manager_type)this;
  std::make_unique<TilesBoard,std::_Bind<void(Fifteen::*(Fifteen*))()>>
            ((_Bind<void_(Fifteen::*(Fifteen_*))()> *)&local_190);
  __p = local_190.d;
  local_190.d = (Data *)0x0;
  std::__uniq_ptr_impl<TilesBoard,_std::default_delete<TilesBoard>_>::reset
            ((__uniq_ptr_impl<TilesBoard,_std::default_delete<TilesBoard>_> *)&this->tilesBoard,
             (pointer)__p);
  std::unique_ptr<TilesBoard,_std::default_delete<TilesBoard>_>::~unique_ptr
            ((unique_ptr<TilesBoard,_std::default_delete<TilesBoard>_> *)&local_190);
  std::make_unique<Panel>();
  uVar2 = panelSlots._M_elems[0].super__Function_base._M_functor._M_unused._0_8_;
  panelSlots._M_elems[0].super__Function_base._M_functor._M_unused._M_object = (void *)0x0;
  std::__uniq_ptr_impl<Panel,_std::default_delete<Panel>_>::reset
            ((__uniq_ptr_impl<Panel,_std::default_delete<Panel>_> *)&this->panel,(pointer)uVar2);
  std::unique_ptr<Panel,_std::default_delete<Panel>_>::~unique_ptr
            ((unique_ptr<Panel,_std::default_delete<Panel>_> *)&panelSlots);
  std::make_unique<MenuBar>();
  uVar2 = panelSlots._M_elems[0].super__Function_base._M_functor._M_unused._0_8_;
  panelSlots._M_elems[0].super__Function_base._M_functor._M_unused._M_object = (void *)0x0;
  std::__uniq_ptr_impl<MenuBar,_std::default_delete<MenuBar>_>::reset
            ((__uniq_ptr_impl<MenuBar,_std::default_delete<MenuBar>_> *)&this->menuBar,
             (pointer)uVar2);
  std::unique_ptr<MenuBar,_std::default_delete<MenuBar>_>::~unique_ptr
            ((unique_ptr<MenuBar,_std::default_delete<MenuBar>_> *)&panelSlots);
  pMVar1 = (this->menuBar)._M_t.super___uniq_ptr_impl<MenuBar,_std::default_delete<MenuBar>_>._M_t.
           super__Tuple_impl<0UL,_MenuBar_*,_std::default_delete<MenuBar>_>.
           super__Head_base<0UL,_MenuBar_*,_false>._M_head_impl;
  panelSlots._M_elems[0].super__Function_base._M_functor._M_unused._M_object = slotLoadGraphic;
  panelSlots._M_elems[0].super__Function_base._M_functor._8_8_ = 0;
  panelSlots._M_elems[0].super__Function_base._M_manager = (_Manager_type)this;
  std::function<void()>::function<std::_Bind<void(Fifteen::*(Fifteen*))()>,void>
            ((function<void()> *)&local_78,(_Bind<void_(Fifteen::*(Fifteen_*))()> *)&panelSlots);
  QString::QString((QString *)&local_190,"Load Graphic File");
  MenuBar::bindSlot(pMVar1,OPEN_GRAPHIC,&local_78,&this->super_QMainWindow,(QString *)&local_190);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_190);
  std::_Function_base::~_Function_base(&local_78.super__Function_base);
  pMVar1 = (this->menuBar)._M_t.super___uniq_ptr_impl<MenuBar,_std::default_delete<MenuBar>_>._M_t.
           super__Tuple_impl<0UL,_MenuBar_*,_std::default_delete<MenuBar>_>.
           super__Head_base<0UL,_MenuBar_*,_false>._M_head_impl;
  panelSlots._M_elems[0].super__Function_base._M_functor._M_unused._M_object = slotRemoveGraphic;
  panelSlots._M_elems[0].super__Function_base._M_functor._8_8_ = 0;
  panelSlots._M_elems[0].super__Function_base._M_manager = (_Manager_type)this;
  std::function<void()>::function<std::_Bind<void(Fifteen::*(Fifteen*))()>,void>
            ((function<void()> *)&local_98,(_Bind<void_(Fifteen::*(Fifteen_*))()> *)&panelSlots);
  QString::QString((QString *)&local_190,"Remove Graphic");
  MenuBar::bindSlot(pMVar1,REM_GRAPHIC,&local_98,&this->super_QMainWindow,(QString *)&local_190);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_190);
  std::_Function_base::~_Function_base(&local_98.super__Function_base);
  pMVar1 = (this->menuBar)._M_t.super___uniq_ptr_impl<MenuBar,_std::default_delete<MenuBar>_>._M_t.
           super__Tuple_impl<0UL,_MenuBar_*,_std::default_delete<MenuBar>_>.
           super__Head_base<0UL,_MenuBar_*,_false>._M_head_impl;
  panelSlots._M_elems[0].super__Function_base._M_functor._M_unused._M_object = slotSaveBoard;
  panelSlots._M_elems[0].super__Function_base._M_functor._8_8_ = 0;
  panelSlots._M_elems[0].super__Function_base._M_manager = (_Manager_type)this;
  std::function<void()>::function<std::_Bind<void(Fifteen::*(Fifteen*))()>,void>
            ((function<void()> *)&local_b8,(_Bind<void_(Fifteen::*(Fifteen_*))()> *)&panelSlots);
  QString::QString((QString *)&local_190,"Save Board");
  MenuBar::bindSlot(pMVar1,SAVE_BOARD,&local_b8,&this->super_QMainWindow,(QString *)&local_190);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_190);
  std::_Function_base::~_Function_base(&local_b8.super__Function_base);
  pMVar1 = (this->menuBar)._M_t.super___uniq_ptr_impl<MenuBar,_std::default_delete<MenuBar>_>._M_t.
           super__Tuple_impl<0UL,_MenuBar_*,_std::default_delete<MenuBar>_>.
           super__Head_base<0UL,_MenuBar_*,_false>._M_head_impl;
  panelSlots._M_elems[0].super__Function_base._M_functor._M_unused._M_object = slotReadBoard;
  panelSlots._M_elems[0].super__Function_base._M_functor._8_8_ = 0;
  panelSlots._M_elems[0].super__Function_base._M_manager = (_Manager_type)this;
  std::function<void()>::function<std::_Bind<void(Fifteen::*(Fifteen*))()>,void>
            ((function<void()> *)&local_d8,(_Bind<void_(Fifteen::*(Fifteen_*))()> *)&panelSlots);
  QString::QString((QString *)&local_190,"Load Board");
  MenuBar::bindSlot(pMVar1,LOAD_BOARD,&local_d8,&this->super_QMainWindow,(QString *)&local_190);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_190);
  std::_Function_base::~_Function_base(&local_d8.super__Function_base);
  pMVar1 = (this->menuBar)._M_t.super___uniq_ptr_impl<MenuBar,_std::default_delete<MenuBar>_>._M_t.
           super__Tuple_impl<0UL,_MenuBar_*,_std::default_delete<MenuBar>_>.
           super__Head_base<0UL,_MenuBar_*,_false>._M_head_impl;
  panelSlots._M_elems[0].super__Function_base._M_functor._M_unused._M_object = slotSettings;
  panelSlots._M_elems[0].super__Function_base._M_functor._8_8_ = 0;
  panelSlots._M_elems[0].super__Function_base._M_manager = (_Manager_type)this;
  std::function<void()>::function<std::_Bind<void(Fifteen::*(Fifteen*))()>,void>
            ((function<void()> *)&local_f8,(_Bind<void_(Fifteen::*(Fifteen_*))()> *)&panelSlots);
  QString::QString((QString *)&local_190,"Settings");
  MenuBar::bindSlot(pMVar1,SETTINGS,&local_f8,&this->super_QMainWindow,(QString *)&local_190);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_190);
  std::_Function_base::~_Function_base(&local_f8.super__Function_base);
  pMVar1 = (this->menuBar)._M_t.super___uniq_ptr_impl<MenuBar,_std::default_delete<MenuBar>_>._M_t.
           super__Tuple_impl<0UL,_MenuBar_*,_std::default_delete<MenuBar>_>.
           super__Head_base<0UL,_MenuBar_*,_false>._M_head_impl;
  panelSlots._M_elems[0].super__Function_base._M_functor._M_unused._M_object = slotAbout;
  panelSlots._M_elems[0].super__Function_base._M_functor._8_8_ = 0;
  panelSlots._M_elems[0].super__Function_base._M_manager = (_Manager_type)this;
  std::function<void()>::function<std::_Bind<void(Fifteen::*(Fifteen*))()>,void>
            ((function<void()> *)&local_118,(_Bind<void_(Fifteen::*(Fifteen_*))()> *)&panelSlots);
  QString::QString((QString *)&local_190,"About");
  MenuBar::bindSlot(pMVar1,ABOUT,&local_118,&this->super_QMainWindow,(QString *)&local_190);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_190);
  std::_Function_base::~_Function_base(&local_118.super__Function_base);
  MenuBar::createMenuBar
            ((this->menuBar)._M_t.super___uniq_ptr_impl<MenuBar,_std::default_delete<MenuBar>_>._M_t
             .super__Tuple_impl<0UL,_MenuBar_*,_std::default_delete<MenuBar>_>.
             super__Head_base<0UL,_MenuBar_*,_false>._M_head_impl,&this->super_QMainWindow);
  QMainWindow::setMenuBar((QMenuBar *)this);
  local_190.d = (Data *)slotGenerateBoard;
  local_190.ptr = (char16_t *)0x0;
  local_190.size = (qsizetype)this;
  std::function<void()>::function<std::_Bind<void(Fifteen::*(Fifteen*))()>,void>
            ((function<void()> *)&panelSlots,(_Bind<void_(Fifteen::*(Fifteen_*))()> *)&local_190);
  local_40._M_f = (offset_in_Fifteen_to_subr)slotSolveBoard;
  local_40._8_8_ = 0;
  local_40._M_bound_args.super__Tuple_impl<0UL,_Fifteen_*>.super__Head_base<0UL,_Fifteen_*,_false>.
  _M_head_impl = (_Tuple_impl<0UL,_Fifteen_*>)(_Tuple_impl<0UL,_Fifteen_*>)this;
  std::function<void()>::function<std::_Bind<void(Fifteen::*(Fifteen*))()>,void>
            ((function<void()> *)(panelSlots._M_elems + 1),&local_40);
  local_58._M_f = (offset_in_Fifteen_to_subr)slotUndoMove;
  local_58._8_8_ = 0;
  local_58._M_bound_args.super__Tuple_impl<0UL,_Fifteen_*>.super__Head_base<0UL,_Fifteen_*,_false>.
  _M_head_impl = (_Tuple_impl<0UL,_Fifteen_*>)(_Tuple_impl<0UL,_Fifteen_*>)this;
  std::function<void()>::function<std::_Bind<void(Fifteen::*(Fifteen*))()>,void>
            ((function<void()> *)(panelSlots._M_elems + 2),&local_58);
  pQVar3 = Panel::createLayout((this->panel)._M_t.
                               super___uniq_ptr_impl<Panel,_std::default_delete<Panel>_>._M_t.
                               super__Tuple_impl<0UL,_Panel_*,_std::default_delete<Panel>_>.
                               super__Head_base<0UL,_Panel_*,_false>._M_head_impl,&panelSlots,
                               &this->super_QMainWindow);
  pQVar4 = (QWidget *)operator_new(0x28);
  QWidget::QWidget(pQVar4,this,0);
  QWidget::setContentsMargins((int)pQVar4,0x14,0x14,0);
  this_00 = (QHBoxLayout *)operator_new(0x20);
  QHBoxLayout::QHBoxLayout(this_00,pQVar4);
  pQVar5 = TilesBoard::createGroupBox
                     ((this->tilesBoard)._M_t.
                      super___uniq_ptr_impl<TilesBoard,_std::default_delete<TilesBoard>_>._M_t.
                      super__Tuple_impl<0UL,_TilesBoard_*,_std::default_delete<TilesBoard>_>.
                      super__Head_base<0UL,_TilesBoard_*,_false>._M_head_impl);
  QBoxLayout::addWidget(this_00,pQVar5,0,0);
  QBoxLayout::addLayout((QLayout *)this_00,(int)pQVar3);
  QMainWindow::setCentralWidget((QWidget *)this);
  redrawTiles(this);
  std::array<std::function<void_()>,_3UL>::~array(&panelSlots);
  return;
}

Assistant:

void Fifteen::initGame()
{
    resize( 850, 600 );
    controller = std::make_unique<Controller>();
    tilesBoard = std::make_unique<TilesBoard>( std::bind( &Fifteen::pressTile, this ));
    panel = std::make_unique<Panel>();

    menuBar = std::make_unique<MenuBar>();
    menuBar->bindSlot( ActionMenu::OPEN_GRAPHIC, std::bind( &Fifteen::slotLoadGraphic, this ), this, "Load Graphic File" );
    menuBar->bindSlot( ActionMenu::REM_GRAPHIC, std::bind( &Fifteen::slotRemoveGraphic, this ), this, "Remove Graphic" );
    menuBar->bindSlot( ActionMenu::SAVE_BOARD, std::bind( &Fifteen::slotSaveBoard, this ), this, "Save Board" );
    menuBar->bindSlot( ActionMenu::LOAD_BOARD, std::bind( &Fifteen::slotReadBoard, this ), this, "Load Board" );
    menuBar->bindSlot( ActionMenu::SETTINGS, std::bind( &Fifteen::slotSettings, this ), this, "Settings" );
    menuBar->bindSlot( ActionMenu::ABOUT, std::bind( &Fifteen::slotAbout, this ), this, "About" );

    QMenuBar* menu = menuBar->createMenuBar( this );
    setMenuBar( menu );

    std::array<std::function<void( void )>, 3> panelSlots =
    {
        std::bind( &Fifteen::slotGenerateBoard, this ),
        std::bind( &Fifteen::slotSolveBoard, this ),
        std::bind( &Fifteen::slotUndoMove, this ),
    };
    QVBoxLayout* layout = panel->createLayout( panelSlots, this );

    QWidget* mainPanel = new QWidget( this );
    mainPanel->setContentsMargins( 20, 20, 0, 20 );

    QHBoxLayout* mainLayout = new QHBoxLayout( mainPanel );
    QGroupBox* boxImages = tilesBoard->createGroupBox();
    mainLayout->addWidget( boxImages );
    mainLayout->addLayout( layout );
    setCentralWidget( mainPanel );

    redrawTiles();
}